

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButton::setText(QAbstractButton *this,QString *text)

{
  QString *s1;
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QKeySequence newMnemonic;
  undefined1 *local_58;
  code *local_50;
  undefined8 local_48;
  QAbstractButton *pQStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  s1 = (QString *)(lVar1 + 600);
  bVar2 = ::comparesEqual(s1,text);
  if (!bVar2) {
    QString::operator=(s1,(QString *)text);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QKeySequence::mnemonic((QString *)&local_58);
    setShortcut(this,(QKeySequence *)&local_58);
    *(undefined8 *)(lVar1 + 0x2ac) = 0xffffffffffffffff;
    QWidget::update(&this->super_QWidget);
    QWidget::updateGeometry(&this->super_QWidget);
    local_50 = QFont::strikeOut;
    local_48 = 0xaaaaaaaa0000800c;
    local_38 = 0xaaaaaaaaffffffff;
    pQStack_40 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
    QKeySequence::~QKeySequence((QKeySequence *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::setText(const QString &text)
{
    Q_D(QAbstractButton);
    if (d->text == text)
        return;
    d->text = text;
#ifndef QT_NO_SHORTCUT
    QKeySequence newMnemonic = QKeySequence::mnemonic(text);
    setShortcut(newMnemonic);
#endif
    d->sizeHint = QSize();
    update();
    updateGeometry();
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::NameChanged);
    QAccessible::updateAccessibility(&event);
#endif
}